

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdNormalizeCompare(char *pStr,int *pMarks,int i,int j)

{
  char *pcVar1;
  char *pcVar2;
  char *pLimit2;
  char *pLimit1;
  char *pStr2;
  char *pStr1;
  int j_local;
  int i_local;
  int *pMarks_local;
  char *pStr_local;
  
  pStr2 = pStr + pMarks[i];
  pLimit1 = pStr + pMarks[j];
  pcVar1 = pStr + pMarks[i + 1];
  pcVar2 = pStr + pMarks[j + 1];
  do {
    if (pcVar1 <= pStr2 || pcVar2 <= pLimit1) {
      if ((pcVar1 <= pStr2) && (pcVar2 <= pLimit1)) {
        __assert_fail("pStr1 < pLimit1 || pStr2 < pLimit2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0xb5,"int Dau_DsdNormalizeCompare(char *, int *, int, int)");
      }
      if (pStr2 == pcVar1) {
        pStr_local._4_4_ = -1;
      }
      else {
        if (pLimit1 != pcVar2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                        ,0xba,"int Dau_DsdNormalizeCompare(char *, int *, int, int)");
        }
        pStr_local._4_4_ = 1;
      }
      return pStr_local._4_4_;
    }
    if ((*pStr2 < 'a') || ('z' < *pStr2)) {
      pLimit1 = pLimit1 + -1;
    }
    else if ((*pLimit1 < 'a') || ('z' < *pLimit1)) {
      pStr2 = pStr2 + -1;
    }
    else {
      if (*pStr2 < *pLimit1) {
        return -1;
      }
      if (*pLimit1 < *pStr2) {
        return 1;
      }
    }
    pStr2 = pStr2 + 1;
    pLimit1 = pLimit1 + 1;
  } while( true );
}

Assistant:

int Dau_DsdNormalizeCompare( char * pStr, int * pMarks, int i, int j )
{
    char * pStr1 = pStr + pMarks[i];
    char * pStr2 = pStr + pMarks[j];
    char * pLimit1 = pStr + pMarks[i+1];
    char * pLimit2 = pStr + pMarks[j+1];
    for ( ; pStr1 < pLimit1 && pStr2 < pLimit2; pStr1++, pStr2++ )
    {
        if ( !(*pStr1 >= 'a' &&  *pStr1 <= 'z') )
        {
            pStr2--;
            continue;
        }
        if ( !(*pStr2 >= 'a' &&  *pStr2 <= 'z') )
        {
            pStr1--;
            continue;
        }
        if ( *pStr1 < *pStr2 )
            return -1;
        if ( *pStr1 > *pStr2 )
            return 1;
    }
    assert( pStr1 < pLimit1 || pStr2 < pLimit2 );
    if ( pStr1 == pLimit1 )
        return -1;
    if ( pStr2 == pLimit2 )
        return 1;
    assert( 0 );
    return 0;
}